

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMRangeImpl::setEndBefore(DOMRangeImpl *this,DOMNode *refNode)

{
  DOMDocument *pDVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  DOMNode *n;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNode *pDVar5;
  DOMException *this_00;
  XMLSize_t XVar6;
  code *pcVar7;
  pointer_____offset_0x10___ *ppuVar8;
  long lVar9;
  
  if (this->fDetached == true) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,0xb,0,this->fMemoryManager);
LAB_0027a193:
    ppuVar8 = &DOMException::typeinfo;
    pcVar7 = DOMException::~DOMException;
  }
  else {
    bVar2 = hasLegalRootContainer(this,refNode);
    if ((refNode != (DOMNode *)0x0) && (bVar2)) {
      uVar3 = (*refNode->_vptr_DOMNode[4])(refNode);
      if ((0xc < uVar3) || ((0x1a44U >> (uVar3 & 0x1f) & 1) == 0)) {
        pDVar1 = this->fDocument;
        iVar4 = (*refNode->_vptr_DOMNode[0xc])(refNode);
        if (pDVar1 == (DOMDocument *)CONCAT44(extraout_var,iVar4)) {
LAB_0027a081:
          iVar4 = (*refNode->_vptr_DOMNode[5])(refNode);
          this->fEndContainer = (DOMNode *)CONCAT44(extraout_var_00,iVar4);
          lVar9 = 1;
          pDVar5 = refNode;
          do {
            iVar4 = (*pDVar5->_vptr_DOMNode[9])(pDVar5);
            pDVar5 = (DOMNode *)CONCAT44(extraout_var_01,iVar4);
            lVar9 = lVar9 + -1;
          } while (pDVar5 != (DOMNode *)0x0);
          XVar6 = 0;
          if (lVar9 != 1) {
            XVar6 = -lVar9;
          }
          this->fEndOffset = XVar6;
          pDVar5 = commonAncestorOf(this,refNode,this->fStartContainer);
          if (pDVar5 == (DOMNode *)0x0) {
            (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,0);
          }
          iVar4 = (*(this->super_DOMRange)._vptr_DOMRange[0x11])(this,3,this);
          if ((short)iVar4 == 1) {
            (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,0);
            return;
          }
          this->fCollapsed = false;
          return;
        }
        pDVar5 = &this->fDocument->super_DOMNode;
        if (this->fDocument == (DOMDocument *)0x0) {
          pDVar5 = (DOMNode *)0x0;
        }
        if (pDVar5 == refNode) goto LAB_0027a081;
        (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,0);
        this->fCollapsed = true;
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(this_00,4,0,this->fMemoryManager);
        goto LAB_0027a193;
      }
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMRangeException::DOMRangeException((DOMRangeException *)this_00,0x70,0,this->fMemoryManager);
    ppuVar8 = &DOMRangeException::typeinfo;
    pcVar7 = DOMRangeException::~DOMRangeException;
  }
  __cxa_throw(this_00,ppuVar8,pcVar7);
}

Assistant:

void DOMRangeImpl::setEndBefore(const DOMNode* refNode)
{
    if( fDetached) {
        throw DOMException(
            DOMException::INVALID_STATE_ERR, 0, fMemoryManager);
    }
    if ( !hasLegalRootContainer(refNode) || !isLegalContainedNode(refNode)) {
        throw DOMRangeException(
            DOMRangeException::INVALID_NODE_TYPE_ERR, 0, fMemoryManager);
    }

    // error if not the same owner document
    if (fDocument != refNode->getOwnerDocument()) {
        if ( refNode != fDocument ) {
            collapse(false); //collapse the range positions to end
            fCollapsed = true;
            throw DOMException(
                DOMException::WRONG_DOCUMENT_ERR, 0, fMemoryManager);
        }
    }

    fEndContainer = refNode->getParentNode();
    XMLSize_t i = 0;
    for (DOMNode* n = (DOMNode*) refNode; n!=0; n = n->getPreviousSibling(), i++) ;

    if (i< 1)
        fEndOffset = 0;
    else
        fEndOffset = i-1;

    // they may be of same document, but not same root container
    // collapse if not the same root container
    if (!commonAncestorOf(refNode, fStartContainer))
        collapse(false);

    //compare the start and end boundary point
    //collapse if start point is after the end point
    if(compareBoundaryPoints(DOMRange::END_TO_START, this) == 1)
        collapse(false); //collapse the range positions to end
    else
        fCollapsed = false;
}